

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O1

void __thiscall FGLRenderer::SetFixedColormap(FGLRenderer *this,player_t *player)

{
  player_t *ppVar1;
  AInventory *pAVar2;
  AInventory *pAVar3;
  PClass *pPVar4;
  DWORD DVar5;
  PClass *pPVar6;
  PClass *pPVar7;
  PClass *pPVar8;
  bool bVar9;
  
  gl_fixedcolormap = 0;
  ppVar1 = ((player->camera).field_0.p)->player;
  if (ppVar1 != (player_t *)0x0) {
    if (ppVar1->fixedcolormap == -1) {
      if (ppVar1->fixedlightlevel != -1) {
        pAVar2 = (ppVar1->mo->super_AActor).Inventory.field_0.p;
        if ((pAVar2 != (AInventory *)0x0) &&
           (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (ppVar1->mo->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          pAVar2 = (AInventory *)0x0;
        }
        while (pAVar3 = pAVar2, pAVar3 != (AInventory *)0x0) {
          (**(code **)((long)(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject +
                      0x200))(pAVar3);
          pPVar7 = APowerTorch::RegistrationInfo.MyClass;
          if ((pAVar3->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
            pPVar6 = (PClass *)
                     (**(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar3);
            (pAVar3->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
          }
          pPVar4 = APowerLightAmp::RegistrationInfo.MyClass;
          pPVar6 = (pAVar3->super_AActor).super_DThinker.super_DObject.Class;
          bVar9 = pPVar6 != (PClass *)0x0;
          pPVar8 = pPVar6;
          if (pPVar6 != pPVar7 && bVar9) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar9 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar7) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if (bVar9) {
            DVar5 = (int)ppVar1->fixedlightlevel + 0x20000010;
LAB_0044c038:
            gl_fixedcolormap = DVar5;
          }
          else {
            if (pPVar6 == (PClass *)0x0) {
              pPVar7 = (PClass *)
                       (**(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar3)
              ;
              (pAVar3->super_AActor).super_DThinker.super_DObject.Class = pPVar7;
            }
            pPVar7 = (pAVar3->super_AActor).super_DThinker.super_DObject.Class;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 != pPVar4 && bVar9) {
              do {
                pPVar7 = pPVar7->ParentClass;
                bVar9 = pPVar7 != (PClass *)0x0;
                if (pPVar7 == pPVar4) break;
              } while (pPVar7 != (PClass *)0x0);
            }
            DVar5 = 0x20000000;
            if (bVar9) goto LAB_0044c038;
          }
          pAVar2 = (pAVar3->super_AActor).Inventory.field_0.p;
          if ((pAVar2 != (AInventory *)0x0) &&
             (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
            (pAVar3->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
            pAVar2 = (AInventory *)0x0;
          }
        }
      }
    }
    else {
      gl_fixedcolormap = (int)ppVar1->fixedcolormap + 1;
    }
  }
  gl_RenderState.mColormapState = gl_fixedcolormap;
  return;
}

Assistant:

void FGLRenderer::SetFixedColormap (player_t *player)
{
	gl_fixedcolormap=CM_DEFAULT;

	// check for special colormaps
	player_t * cplayer = player->camera->player;
	if (cplayer) 
	{
		if (cplayer->extralight == INT_MIN)
		{
			gl_fixedcolormap=CM_FIRSTSPECIALCOLORMAP + INVERSECOLORMAP;
			extralight=0;
		}
		else if (cplayer->fixedcolormap != NOFIXEDCOLORMAP)
		{
			gl_fixedcolormap = CM_FIRSTSPECIALCOLORMAP + cplayer->fixedcolormap;
		}
		else if (cplayer->fixedlightlevel != -1)
		{
			for(AInventory * in = cplayer->mo->Inventory; in; in = in->Inventory)
			{
				PalEntry color = in->GetBlend ();

				// Need special handling for light amplifiers 
				if (in->IsKindOf(RUNTIME_CLASS(APowerTorch)))
				{
					gl_fixedcolormap = cplayer->fixedlightlevel + CM_TORCH;
				}
				else if (in->IsKindOf(RUNTIME_CLASS(APowerLightAmp)))
				{
					gl_fixedcolormap = CM_LITE;
				}
			}
		}
	}
	gl_RenderState.SetFixedColormap(gl_fixedcolormap);
}